

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O3

size_t __thiscall
frozen::bits::pmh_tables<4ul,frozen::elsa<unsigned_int>>::lookup<int,frozen::elsa<unsigned_int>>
          (pmh_tables<4ul,frozen::elsa<unsigned_int>> *this,int *key,elsa<unsigned_int> *hasher)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = *(ulong *)this ^ (ulong)(uint)*key;
  uVar2 = uVar2 * 0x200000 + ~uVar2;
  uVar2 = (uVar2 >> 0x18 ^ uVar2) * 0x109;
  uVar1 = ((uint)(uVar2 >> 0xe) ^ (uint)uVar2) * 0x15;
  uVar2 = *(ulong *)(this + (ulong)((uVar1 >> 0x1c ^ uVar1) & 3) * 8 + 8);
  if (-1 < (long)uVar2) {
    return uVar2;
  }
  uVar2 = uVar2 ^ (uint)*key;
  uVar2 = uVar2 * 0x200000 + ~uVar2;
  uVar2 = (uVar2 >> 0x18 ^ uVar2) * 0x109;
  uVar1 = ((uint)(uVar2 >> 0xe) ^ (uint)uVar2) * 0x15;
  return *(size_t *)(this + (ulong)((uVar1 >> 0x1c ^ uVar1) & 3) * 8 + 0x28);
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<std::size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing std::uint64 -> std::size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }